

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void mainverttest(void)

{
  double local_48;
  double ar [3];
  double local_28;
  double ma [3];
  int ret;
  
  local_28 = 1.0;
  ma[0] = -0.06331;
  ma[1] = 0.199;
  local_48 = -1.23;
  ar[0] = 0.4;
  ar[1] = 0.0;
  mdisplay(&local_28,1,3);
  invertroot(3,&local_28);
  mdisplay(&local_28,1,3);
  ma[2]._4_4_ = archeck(2,&local_48);
  printf("ARCHECK %d \n",(ulong)ma[2]._4_4_);
  return;
}

Assistant:

void mainverttest() {
	int ret;
	double ma[3] = {1.0, -0.06331,0.1990};
	double ar[3] = {-1.23,0.4};

	mdisplay(ma,1,3);

	invertroot(3,ma);

	mdisplay(ma,1,3);

	ret = archeck(2,ar);
	printf("ARCHECK %d \n",ret);
}